

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_advance(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  CHAR_DATA *ch_00;
  uint uVar7;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  
  pcVar6 = one_argument(argument,arg1);
  one_argument(pcVar6,arg2);
  if (((arg1[0] == '\0') || (arg2[0] == '\0')) || (bVar3 = is_number(arg2), !bVar3)) {
    pcVar6 = "Syntax: advance <char> <level>.\n\r";
  }
  else {
    ch_00 = get_char_world(ch,arg1);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar6 = "That player is not here.\n\r";
    }
    else {
      bVar3 = is_npc(ch_00);
      if (bVar3) {
        pcVar6 = "Not on NPC\'s.\n\r";
      }
      else {
        iVar4 = atoi(arg2);
        if (iVar4 - 0x3dU < 0xffffffc4) {
          pcVar6 = "Level must be 1 to 60.\n\r";
        }
        else {
          iVar5 = get_trust(ch);
          if (iVar4 <= iVar5) {
            if (ch_00->level < iVar4) {
              send_to_char("Raising a player\'s level!\n\r",ch);
              send_to_char("**** OOOOHHHHHHHHHH  YYYYEEEESSS ****\n\r",ch_00);
            }
            else {
              send_to_char("Lowering a player\'s level!\n\r",ch);
              send_to_char("**** OOOOHHHHHHHHHH  NNNNOOOO ****\n\r",ch_00);
              ch_00->level = 1;
              iVar5 = exp_per_level(ch_00);
              ch_00->exp = iVar5;
              ch_00->max_hit = 10;
              ch_00->max_mana = 100;
              ch_00->max_move = 100;
              pPVar2 = ch_00->pcdata;
              pPVar2->perm_hit = 10;
              pPVar2->perm_mana = 100;
              pPVar2->perm_move = 100;
              ch_00->practice = 0;
              ch_00->train = 0;
              ch_00->hit = 10;
              ch_00->mana = 100;
              ch_00->move = 100;
              advance_level(ch_00,true);
            }
            for (iVar5 = (int)ch_00->level; iVar5 < iVar4; iVar5 = iVar5 + 1) {
              ch_00->level = ch_00->level + 1;
              advance_level(ch_00,false);
            }
            sprintf(buf,"You are now level %d.\n\r");
            send_to_char(buf,ch_00);
            if (0x33 < ch_00->level) {
              CSQLInterface::Delete(&RS.SQL,"players WHERE name = \'%s\'",ch_00->true_name);
            }
            iVar4 = exp_per_level(ch_00);
            uVar1._0_2_ = ch_00->level;
            uVar1._2_2_ = ch_00->trust;
            uVar7 = 1;
            if (1 < (short)(undefined2)uVar1) {
              uVar7 = uVar1;
            }
            ch_00->exp = (uVar7 & 0xffff) * iVar4;
            save_char_obj(ch_00);
            return;
          }
          pcVar6 = "Limited to your trust level.\n\r";
        }
      }
    }
  }
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_advance(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int level, res = 0;
	int iLevel;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0' || !is_number(arg2))
	{
		send_to_char("Syntax: advance <char> <level>.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("That player is not here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	level = atoi(arg2);

	if (level < 1 || level > 60)
	{
		send_to_char("Level must be 1 to 60.\n\r", ch);
		return;
	}

	if (level > get_trust(ch))
	{
		send_to_char("Limited to your trust level.\n\r", ch);
		return;
	}

	/*
	 * Lower level:
	 *   Reset to level 1.
	 *   Then raise again.
	 *   Currently, an imp can lower another imp.
	 *   -- Swiftest
	 */
	if (level <= victim->level)
	{
		int temp_prac;

		send_to_char("Lowering a player's level!\n\r", ch);
		send_to_char("**** OOOOHHHHHHHHHH  NNNNOOOO ****\n\r", victim);
		temp_prac = victim->practice;
		victim->level = 1;
		victim->exp = exp_per_level(victim);
		victim->max_hit = 10;
		victim->max_mana = 100;
		victim->max_move = 100;
		victim->pcdata->perm_hit = 10;
		victim->pcdata->perm_mana = 100;
		victim->pcdata->perm_move = 100;
		victim->practice = 0;
		victim->train = 0;
		victim->hit = victim->max_hit;
		victim->mana = victim->max_mana;
		victim->move = victim->max_move;
		advance_level(victim, true);
	}
	else
	{
		send_to_char("Raising a player's level!\n\r", ch);
		send_to_char("**** OOOOHHHHHHHHHH  YYYYEEEESSS ****\n\r", victim);
	}

	for (iLevel = victim->level; iLevel < level; iLevel++)
	{
		victim->level += 1;
		advance_level(victim, false);
	}

	sprintf(buf, "You are now level %d.\n\r", victim->level);
	send_to_char(buf, victim);

	if (victim->level >= 52)
		res = RS.SQL.Delete("players WHERE name = '%s'", victim->true_name);

	victim->exp = exp_per_level(victim) * std::max(1, (int)victim->level);
	save_char_obj(victim);
}